

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<std::shared_ptr<int>>
          (PromiseError *this,shared_ptr<int> *value)

{
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  this_00 = (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)__cxa_allocate_exception(0x10);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (this_00,&value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  __cxa_throw(this_00,&std::shared_ptr<int>::typeinfo,
              std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }